

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O1

void c6280mame_w(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  ushort *puVar2;
  
  if ((offset & 0xf) < 10) {
    bVar1 = *(byte *)((long)chip + 8);
    puVar2 = (ushort *)((long)chip + (ulong)bVar1 * 0x38 + 0xc);
    switch(offset & 0xf) {
    case 0:
      *(byte *)((long)chip + 8) = data & 7;
      return;
    case 1:
      *(UINT8 *)((long)chip + 9) = data;
      return;
    case 2:
      *puVar2 = (ushort)data | *puVar2 & 0xf00;
      return;
    case 3:
      *(byte *)((long)chip + (ulong)bVar1 * 0x38 + 0xd) = data & 0xf;
      return;
    case 4:
      if (((data & 0x40) == 0) && ((*(byte *)((long)chip + (ulong)bVar1 * 0x38 + 0xe) & 0x40) != 0))
      {
        *(undefined1 *)((long)chip + (ulong)bVar1 * 0x38 + 0x30) = 0;
      }
      *(UINT8 *)((long)chip + (ulong)bVar1 * 0x38 + 0xe) = data;
      return;
    case 5:
      *(UINT8 *)((long)chip + (ulong)bVar1 * 0x38 + 0xf) = data;
      return;
    case 6:
      (*(code *)(&DAT_00179e08 +
                *(int *)(&DAT_00179e08 +
                        (ulong)(*(byte *)((long)chip + (ulong)bVar1 * 0x38 + 0xe) >> 6) * 4)))();
      return;
    case 7:
      *(UINT8 *)((long)chip + (ulong)bVar1 * 0x38 + 0x34) = data;
      return;
    case 8:
      *(UINT8 *)((long)chip + 10) = data;
      return;
    case 9:
      *(UINT8 *)((long)chip + 0xb) = data;
    }
  }
  return;
}

Assistant:

static void c6280mame_w(void *chip, UINT8 offset, UINT8 data)
{
	c6280_t *p = (c6280_t *)chip;
	t_channel *chan = &p->channel[p->select];

	//m_cpudevice->io_set_buffer(data);

	switch(offset & 0x0F)
	{
		case 0x00: /* Channel select */
			p->select = data & 0x07;
			break;

		case 0x01: /* Global balance */
			p->balance  = data;
			break;

		case 0x02: /* Channel frequency (LSB) */
			chan->frequency = (chan->frequency & 0x0F00) | data;
			chan->frequency &= 0x0FFF;
			break;

		case 0x03: /* Channel frequency (MSB) */
			chan->frequency = (chan->frequency & 0x00FF) | (data << 8);
			chan->frequency &= 0x0FFF;
			break;

		case 0x04: /* Channel control (key-on, DDA mode, volume) */

			/* 1-to-0 transition of DDA bit resets waveform index */
			if((chan->control & 0x40) && ((data & 0x40) == 0))
			{
				chan->index = 0;
			}
			chan->control = data;
			break;

		case 0x05: /* Channel balance */
			chan->balance = data;
			break;

		case 0x06: /* Channel waveform data */

			switch(chan->control & 0xC0)
			{
				case 0x00:
				case 0x80:
					chan->waveform[chan->index & 0x1F] = data & 0x1F;
					chan->index = (chan->index + 1) & 0x1F;
					break;

				case 0x40:
					break;

				case 0xC0:
					chan->dda = data & 0x1F;
					break;
			}

			break;

		case 0x07: /* Noise control (enable, frequency) */
			chan->noise_control = data;
			break;

		case 0x08: /* LFO frequency */
			p->lfo_frequency = data;
			break;

		case 0x09: /* LFO control (enable, mode) */
			p->lfo_control = data;
			break;

		default:
			break;
	}
}